

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O1

void __thiscall Object::anglePostCheck(Object *this,Vector2d *obs)

{
  pointer pEVar1;
  int iVar2;
  double dVar3;
  _Map_pointer ppMVar4;
  _Map_pointer ppMVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  _Elt_pointer pMVar9;
  ulong uVar10;
  int iVar11;
  Edge *this_00;
  int k;
  int k_1;
  _Map_pointer ppMVar12;
  int iVar13;
  int iVar14;
  Vector3d pt;
  Edge local_f8;
  _Elt_pointer local_98;
  _Elt_pointer pMStack_90;
  Vector2d *local_88;
  _Elt_pointer local_80;
  long local_78;
  long local_70;
  Matrix<double,_3,_1,_0,_3,_1> local_68;
  Vector2d local_48;
  
  lVar8 = (long)(this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar8 != 0) {
    local_78 = (lVar8 >> 5) * -0x5555555555555555;
    local_78 = local_78 + (ulong)(local_78 == 0);
    local_70 = 0;
    local_88 = obs;
    do {
      pEVar1 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
               super__Vector_impl_data._M_start;
      ppMVar12 = *(_Map_pointer *)
                  ((long)&pEVar1[local_70].
                          super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .
                          super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl + 0x48);
      pMVar9 = ((iterator *)
               ((long)&pEVar1[local_70].
                       super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       .
                       super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ._M_impl + 0x10))->_M_cur;
      uVar10 = ((long)*(_Elt_pointer *)
                       ((long)&pEVar1[local_70].
                               super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                               .
                               super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                               ._M_impl + 0x20) - (long)pMVar9 >> 3) * -0x5555555555555555 +
               ((long)((iterator *)
                      ((long)&pEVar1[local_70].
                              super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              .
                              super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl + 0x30))->_M_cur -
                (long)*(_Elt_pointer *)
                       ((long)&pEVar1[local_70].
                               super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                               .
                               super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                               ._M_impl + 0x38) >> 3) * -0x5555555555555555 +
               (((long)ppMVar12 -
                 (long)*(_Map_pointer *)
                        ((long)&pEVar1[local_70].
                                super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                .
                                super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                ._M_impl + 0x28) >> 3) + -1 + (ulong)(ppMVar12 == (_Map_pointer)0x0)
               ) * 0x15;
      if (3 < uVar10) {
        this_00 = pEVar1 + local_70;
        local_98 = *(_Elt_pointer *)
                    ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                            m_storage + 0x10);
        iVar2 = (int)uVar10;
        iVar7 = iVar2 + -1;
        iVar14 = 2;
        if (2 < iVar7) {
          iVar14 = iVar7;
        }
        iVar13 = -1;
        k_1 = 3;
        iVar2 = iVar2 + -3;
        k = 2;
        do {
          iVar11 = iVar2;
          if (iVar14 == k) goto LAB_00109d84;
          bVar6 = Edge::angleInRange(this_00,(double)local_98,k,k_1);
          iVar13 = iVar13 + -1;
          k_1 = k_1 + 1;
          iVar2 = iVar11 + -1;
          k = k + 1;
        } while (!bVar6);
        local_f8.
        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        .
        super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
        local_f8.
        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        .
        super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
        local_f8.
        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        .
        super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
        local_f8.
        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        .
        super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
        local_f8.
        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        .
        super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
        local_f8.
        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        .
        super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
        local_f8.
        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        .
        super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
        local_f8.
        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        .
        super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
        local_f8.
        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        .
        super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
        local_f8.
        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        .
        super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size = 0;
        std::
        _Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::_M_initialize_map((_Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                             *)&local_f8,0);
        ppMVar5 = local_f8.
                  super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  .
                  super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node;
        ppMVar4 = local_f8.
                  super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  .
                  super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
        local_f8.min_dist = 1000000000.0;
        local_f8.valid = true;
        local_98 = local_f8.
                   super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   .
                   super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
        pMStack_90 = local_f8.
                     super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     .
                     super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first;
        local_80 = local_f8.
                   super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   .
                   super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_last;
        for (ppMVar12 = local_f8.
                        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        .
                        super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node; ppMVar12 < ppMVar5;
            ppMVar12 = ppMVar12 + 1) {
          operator_delete(ppMVar12[1],0x1f8);
        }
        local_f8.
        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        .
        super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_node = ppMVar4;
        local_f8.min_dist = 1000000000.0;
        local_f8.valid = true;
        local_f8.
        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        .
        super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur = local_98;
        local_f8.
        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        .
        super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first = pMStack_90;
        local_f8.
        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        .
        super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_last = local_80;
        if (iVar7 != -iVar13 && SBORROW4(iVar7,-iVar13) == iVar7 + iVar13 < 0) {
          do {
            pMVar9 = (this_00->
                     super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ).
                     super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (pMVar9 == (this_00->
                          super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ).
                          super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              pMVar9 = (this_00->
                       super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ).
                       super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
            }
            local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] = pMVar9[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[2];
            local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] = pMVar9[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[0];
            local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1] = pMVar9[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[1];
            std::
            deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ::pop_back(&this_00->
                        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      );
            if (local_f8.
                super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                .
                super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur ==
                local_f8.
                super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                .
                super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_first) {
              std::
              deque<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
              ::_M_push_front_aux<Eigen::Matrix<double,3,1,0,3,1>&>
                        ((deque<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                          *)&local_f8,&local_68);
            }
            else {
              local_f8.
              super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              .
              super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur[-1].
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
                   = local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2];
              local_f8.
              super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              .
              super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur[-1].
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
                   = local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[0];
              local_f8.
              super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              .
              super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur[-1].
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
                   = local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[1];
              local_f8.
              super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              .
              super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur =
                   local_f8.
                   super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   .
                   super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur + -1;
            }
            iVar11 = iVar11 + -1;
          } while (iVar11 != 0);
        }
        pMVar9 = (this_00->
                 super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ).
                 super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pMVar9 == (this_00->
                      super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ).
                      super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pMVar9 = (this_00->
                   super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ).
                   super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
        }
        if (local_f8.
            super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            .
            super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_f8.
            super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            .
            super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_first) {
          std::
          deque<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
          _M_push_front_aux<Eigen::Matrix<double,3,1,0,3,1>&>
                    ((deque<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                      *)&local_f8,pMVar9 + -1);
        }
        else {
          local_f8.
          super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          .
          super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur[-1].
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
               pMVar9[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
          dVar3 = pMVar9[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[1];
          local_f8.
          super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          .
          super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur[-1].
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
               pMVar9[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
          local_f8.
          super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          .
          super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur[-1].
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
               dVar3;
          local_f8.
          super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          .
          super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_f8.
               super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               .
               super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur + -1;
        }
        local_48.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
        [0] = (local_88->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
              m_data.array[0];
        local_48.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
        [1] = (local_88->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
              m_data.array[1];
        Edge::initWithObs(&local_f8,&local_48);
        std::vector<Edge,_std::allocator<Edge>_>::push_back(&this->edges,&local_f8);
        std::
        _Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::~_Deque_base((_Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)&local_f8);
      }
LAB_00109d84:
      local_70 = local_70 + 1;
    } while (local_70 != local_78);
  }
  return;
}

Assistant:

void Object::anglePostCheck(const Eigen::Vector2d& obs) {
    size_t max_size = edges.size();
    for (size_t j = 0; j < max_size; j++) {
        Edge& eg = edges[j];
        if (eg.size() < 4) continue;
        double front_angle = eg.front().z();
        int size_1 = static_cast<int>(eg.size()) - 1, id = 2;
        bool break_judge = false;
        for (; id < size_1; id++) {
            if (eg.angleInRange(front_angle, id, id + 1) == false) continue;
            break_judge = true;
            break;
        }
        if (break_judge == false) continue;
        int pop_cnt = size_1 - id;
        Edge new_edge;
        for (int i = 0; i < pop_cnt; i++) {
            Eigen::Vector3d pt = eg.back();
            eg.pop_back();
            new_edge.emplace_front(pt);
        }
        new_edge.emplace_front(eg.back());
        new_edge.initWithObs(obs);
        edges.push_back(new_edge);
    }
}